

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * duckdb_re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  uint uVar1;
  Regexp **sub_00;
  Regexp *pRVar2;
  Regexp **ppRVar3;
  Regexp **ppRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ulong uVar6;
  uint16_t uVar7;
  int i;
  ulong uVar8;
  new_allocator<duckdb_re2::Regexp_*> local_51;
  Regexp **local_50;
  ulong local_48;
  Regexp *local_40;
  Regexp **local_38;
  
  uVar7 = (uint16_t)flags;
  if (nsub == 0) {
    pRVar2 = (Regexp *)operator_new(0x28);
    if (op == kRegexpAlternate) {
      pRVar2->op_ = '\x01';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar7;
      pRVar2->ref_ = 1;
    }
    else {
      pRVar2->op_ = '\x02';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar7;
      pRVar2->ref_ = 1;
    }
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->arguments).char_class.cc_ + 6) = 0;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined2 *)((long)&pRVar2->arguments + 0xe) = 0;
    return pRVar2;
  }
  uVar8 = (ulong)(uint)nsub;
  if (nsub == 1) {
    return *sub;
  }
  if (can_factor && op == kRegexpAlternate) {
    sub_00 = __gnu_cxx::new_allocator<duckdb_re2::Regexp_*>::allocate
                       (&local_51,(long)nsub,(void *)0x0);
    memmove(sub_00,sub,(long)nsub << 3);
    uVar1 = FactorAlternation(sub_00,nsub,flags);
    uVar8 = (ulong)uVar1;
    ppRVar3 = sub_00;
    if (uVar1 == 1) {
      pRVar2 = *sub_00;
      goto LAB_004817e9;
    }
  }
  else {
    sub_00 = sub;
    ppRVar3 = (Regexp **)0x0;
  }
  local_48 = uVar8;
  if ((int)uVar8 < 0x10000) {
    pRVar2 = (Regexp *)operator_new(0x28);
    pRVar2->op_ = (uint8_t)op;
    pRVar2->simple_ = '\0';
    pRVar2->parse_flags_ = uVar7;
    pRVar2->ref_ = 1;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->arguments).char_class.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar2->arguments + 0xe) = 0;
    uVar8 = local_48 & 0xffffffff;
    if (1 < (int)local_48) {
      ppRVar4 = (Regexp **)operator_new__(uVar8 * 8);
      (pRVar2->field_5).submany_ = ppRVar4;
    }
    pRVar2->nsub_ = (ushort)local_48;
    if ((ushort)local_48 < 2) {
      paVar5 = &pRVar2->field_5;
    }
    else {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
    }
    if (0 < (int)local_48) {
      uVar6 = 0;
      do {
        paVar5[uVar6] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub_00 + uVar6);
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
  }
  else {
    local_50 = ppRVar3;
    pRVar2 = (Regexp *)operator_new(0x28);
    uVar1 = (int)local_48 + 0xfffe;
    pRVar2->op_ = (uint8_t)op;
    pRVar2->simple_ = '\0';
    pRVar2->parse_flags_ = uVar7;
    pRVar2->ref_ = 1;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->arguments).char_class.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar2->arguments + 0xe) = 0;
    ppRVar3 = (Regexp **)operator_new__((ulong)((uVar1 / 0xffff) * 8));
    (pRVar2->field_5).submany_ = ppRVar3;
    pRVar2->nsub_ = (uint16_t)(uVar1 / 0xffff);
    uVar1 = uVar1 / 0xffff - 1;
    uVar8 = 0;
    local_40 = pRVar2;
    local_38 = sub_00;
    do {
      pRVar2 = ConcatOrAlternate(op,sub_00,0xffff,flags,false);
      ppRVar3[uVar8] = pRVar2;
      uVar8 = uVar8 + 1;
      sub_00 = sub_00 + 0xffff;
    } while (uVar1 != uVar8);
    pRVar2 = ConcatOrAlternate(op,local_38 + uVar1 * 0xffff,(int)local_48 + uVar1 * -0xffff,flags,
                               false);
    ppRVar3[uVar1] = pRVar2;
    ppRVar3 = local_50;
    pRVar2 = local_40;
  }
LAB_004817e9:
  if (ppRVar3 != (Regexp **)0x0) {
    operator_delete(ppRVar3);
  }
  return pRVar2;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  PODArray<Regexp*> subcopy;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = PODArray<Regexp*>(nsub);
    memmove(subcopy.data(), sub, nsub * sizeof sub[0]);
    sub = subcopy.data();
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];
  return re;
}